

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsValueRef
WScriptJsrt::SleepCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  double local_30;
  double timeout;
  JsValueRef returnValue;
  
  timeout = 0.0;
  JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)((JsValueRef *)&timeout);
  if ((1 < argumentCount) && (JVar1 == JsNoError)) {
    local_30 = 0.0;
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToDouble)(arguments[1],&local_30);
    Sleep((DWORD)(long)local_30);
  }
  return (JsValueRef)timeout;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::SleepCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));

    if (argumentCount > 1)
    {
        double timeout = 0.0;
        ChakraRTInterface::JsNumberToDouble(arguments[1], &timeout);
        Sleep((DWORD)timeout);
    }

Error:
    return returnValue;
}